

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svgproperty.cpp
# Opt level: O2

bool __thiscall lunasvg::SVGAngle::parse(SVGAngle *this,string_view input)

{
  basic_string_view<char,_std::char_traits<char>_> __x;
  basic_string_view<char,_std::char_traits<char>_> __x_00;
  basic_string_view<char,_std::char_traits<char>_> __x_01;
  basic_string_view<char,_std::char_traits<char>_> __x_02;
  basic_string_view<char,_std::char_traits<char>_> __x_03;
  bool bVar1;
  basic_string_view<char,_std::char_traits<char>_> __x_04;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_00;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_01;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_02;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_03;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_04;
  float value;
  string_view input_local;
  
  input_local._M_str = input._M_str;
  input_local._M_len = input._M_len;
  stripLeadingAndTrailingSpaces(&input_local);
  __x._M_str = input_local._M_str;
  __x._M_len = input_local._M_len;
  __y._M_str = "auto";
  __y._M_len = 4;
  bVar1 = std::operator==(__x,__y);
  if (bVar1) {
    *(undefined8 *)&(this->super_SVGProperty).field_0xc = 0;
  }
  else {
    __x_00._M_str = input_local._M_str;
    __x_00._M_len = input_local._M_len;
    __y_00._M_str = "auto-start-reverse";
    __y_00._M_len = 0x12;
    bVar1 = std::operator==(__x_00,__y_00);
    if (bVar1) {
      *(undefined8 *)&(this->super_SVGProperty).field_0xc = 0x100000000;
    }
    else {
      value = 0.0;
      bVar1 = parseNumber<float>(&input_local,&value);
      if (!bVar1) {
        return false;
      }
      if (input_local._M_len != 0) {
        __x_04._M_str = input_local._M_str;
        __x_04._M_len = input_local._M_len;
        __y_01._M_str = "rad";
        __y_01._M_len = 3;
        bVar1 = std::operator==(__x_04,__y_01);
        if (bVar1) {
          value = value * 57.295776;
        }
        else {
          __x_01._M_str = input_local._M_str;
          __x_01._M_len = input_local._M_len;
          __y_02._M_str = "grad";
          __y_02._M_len = 4;
          bVar1 = std::operator==(__x_01,__y_02);
          if (bVar1) {
            value = value * 0.9;
          }
          else {
            __x_02._M_str = input_local._M_str;
            __x_02._M_len = input_local._M_len;
            __y_03._M_str = "turn";
            __y_03._M_len = 4;
            bVar1 = std::operator==(__x_02,__y_03);
            if (bVar1) {
              value = value * 360.0;
            }
            else {
              __x_03._M_str = input_local._M_str;
              __x_03._M_len = input_local._M_len;
              __y_04._M_str = "deg";
              __y_04._M_len = 3;
              bVar1 = std::operator!=(__x_03,__y_04);
              if (bVar1) {
                return false;
              }
            }
          }
        }
      }
      *(float *)&(this->super_SVGProperty).field_0xc = value;
      this->m_orientType = Angle;
    }
  }
  return true;
}

Assistant:

bool SVGAngle::parse(std::string_view input)
{
    stripLeadingAndTrailingSpaces(input);
    if(input == "auto") {
        m_value = 0.f;
        m_orientType = OrientType::Auto;
        return true;
    }

    if(input == "auto-start-reverse") {
        m_value = 0.f;
        m_orientType = OrientType::AutoStartReverse;
        return true;
    }

    float value = 0.f;
    if(!parseNumber(input, value))
        return false;
    if(!input.empty()) {
        if(input == "rad")
            value *= 180.f / PLUTOVG_PI;
        else if(input == "grad")
            value *= 360.f / 400.f;
        else if(input == "turn")
            value *= 360.f;
        else if(input != "deg") {
            return false;
        }
    }

    m_value = value;
    m_orientType = OrientType::Angle;
    return true;
}